

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O1

PmError Pm_Write(PortMidiStream *stream,PmEvent *buffer,int32_t length)

{
  PmEvent *pPVar1;
  uint uVar2;
  byte bVar3;
  PmError PVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  PmError PVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  
  pm_hosterror = 0;
  PVar8 = pmBadPtr;
  if (stream == (PortMidiStream *)0x0) {
    PVar4 = pmNoData;
  }
  else {
    PVar4 = pmNoData;
    if (descriptors[*stream].pub.opened != 0) {
      bVar11 = descriptors[*stream].pub.output != 0;
      PVar8 = pmBadPtr;
      if (bVar11) {
        PVar8 = PVar4;
      }
      PVar4 = (PmError)bVar11;
    }
  }
  if ((char)PVar4 != '\0') {
    if (*(int *)((long)stream + 0x28) == 0) {
      *(undefined4 *)((long)stream + 0x48) = 0;
    }
    else {
      iVar5 = (**(code **)((long)stream + 8))(*(undefined8 *)((long)stream + 0x10));
      *(int *)((long)stream + 0x48) = iVar5;
      if ((*(int *)((long)stream + 0x4c) != 0) || (*(int *)((long)stream + 0x44) + 100 < iVar5)) {
        uVar6 = (**(code **)(*(long *)((long)stream + 0x50) + 0x30))(stream);
        *(undefined4 *)((long)stream + 0x48) = uVar6;
        *(undefined4 *)((long)stream + 0x4c) = 0;
      }
    }
    if (length < 1) {
      PVar8 = pmNoData;
    }
    else {
      uVar9 = 0;
      PVar8 = pmNoData;
      do {
        pPVar1 = buffer + uVar9;
        uVar2 = pPVar1->message;
        if ((uVar2 & 0xff) == 0xf0) {
          if (*(int *)((long)stream + 0x2c) == 0) {
            *(undefined4 *)((long)stream + 0x2c) = 1;
            PVar8 = (**(code **)(*(long *)((long)stream + 0x50) + 8))(stream,pPVar1->timestamp);
            uVar10 = 2;
            if ((PVar8 == pmNoData) &&
               (PVar8 = (**(code **)(*(long *)((long)stream + 0x50) + 0x18))
                                  (stream,0xf0,pPVar1->timestamp), PVar8 == pmNoData)) {
              PVar8 = pmNoData;
              iVar5 = 8;
              goto LAB_00103a89;
            }
          }
          else {
            *(undefined4 *)((long)stream + 0x2c) = 0;
LAB_00103c2a:
            PVar8 = pmBadData;
LAB_00103c2f:
            uVar10 = 2;
          }
        }
        else {
          if ((uVar2 & 0xff) != 0xf7 && (char)uVar2 < '\0') {
            if (*(int *)((long)stream + 0x2c) == 0) {
              PVar8 = (*(code *)**(undefined8 **)((long)stream + 0x50))(stream,pPVar1);
              uVar10 = (uint)(PVar8 == pmNoData) * 3 + 2;
              goto LAB_00103c35;
            }
            if ((~uVar2 & 0xf8) != 0) {
              *(undefined4 *)((long)stream + 0x2c) = 0;
              (**(code **)(*(long *)((long)stream + 0x50) + 0x10))(stream,0);
              goto LAB_00103c2a;
            }
            PVar8 = (**(code **)(*(long *)((long)stream + 0x50) + 0x20))(stream,pPVar1);
            if (PVar8 == pmNoData) {
              iVar5 = 0;
              PVar8 = pmNoData;
              goto LAB_00103a89;
            }
            goto LAB_00103c2f;
          }
          iVar5 = 0;
LAB_00103a89:
          if (*(int *)((long)stream + 0x2c) == 0) goto LAB_00103c2a;
          if (((((uVar2 & 0xff) == 0xf0) || (*(long *)((long)stream + 0x60) == 0)) ||
              ((uVar2 & 0x80808080) != 0)) ||
             (*(uint *)((long)stream + 0x70) < **(uint **)((long)stream + 0x68) + 4)) {
            do {
              bVar3 = (byte)iVar5 & 0x1f;
              uVar10 = uVar2 >> bVar3;
              PVar8 = (**(code **)(*(long *)((long)stream + 0x50) + 0x18))
                                (stream,uVar10 & 0xff,pPVar1->timestamp);
              if (PVar8 == pmNoData) {
                if ((char)uVar10 == -9) {
                  PVar8 = (**(code **)(*(long *)((long)stream + 0x50) + 0x10))(stream,0);
                  *(undefined4 *)((long)stream + 0x2c) = 0;
                  if (PVar8 == pmHostError) {
                    (**(code **)(*(long *)((long)stream + 0x50) + 0x60))
                              (stream,pm_hosterror_text,0x100);
                    pm_hosterror = 1;
                  }
                  uVar7 = 8 - (PVar8 == pmNoData);
                }
                else {
                  iVar5 = iVar5 + 8;
                  uVar7 = 0;
                  PVar8 = pmNoData;
                }
              }
              else {
                uVar7 = 2;
              }
              uVar10 = 0 >> bVar3;
              if (uVar7 != 0) {
                if (uVar7 != 7) {
                  uVar10 = uVar7;
                }
                break;
              }
            } while (iVar5 < 0x20);
          }
          else {
            *(uint *)(*(long *)((long)stream + 0x60) + (ulong)**(uint **)((long)stream + 0x68)) =
                 uVar2;
            **(int **)((long)stream + 0x68) = **(int **)((long)stream + 0x68) + 4;
            uVar10 = 5;
          }
        }
LAB_00103c35:
        if ((uVar10 != 0) && (uVar10 != 5)) {
          if (uVar10 != 2) {
            return PVar8;
          }
          goto LAB_00103c8c;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != (uint)length);
    }
    if (*(int *)((long)stream + 0x2c) == 0) {
      PVar8 = (**(code **)(*(long *)((long)stream + 0x50) + 0x28))(stream,0);
    }
  }
LAB_00103c8c:
  if (PVar8 == pmHostError) {
    (**(code **)(*(long *)((long)stream + 0x50) + 0x60))(stream,pm_hosterror_text,0x100);
    pm_hosterror = 1;
    PVar8 = pmHostError;
  }
  return PVar8;
}

Assistant:

PMEXPORT PmError Pm_Write( PortMidiStream *stream, PmEvent *buffer, int32_t length)
{
    PmInternal *midi = (PmInternal *) stream;
    PmError err = pmNoError;
    int i;
    int bits;
    
    pm_hosterror = FALSE;
    /* arg checking */
    if(midi == NULL)
        err = pmBadPtr;
    else if(!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    else if(!descriptors[midi->device_id].pub.output)
        err = pmBadPtr;
    else
        err = pmNoError;
    
    if (err != pmNoError) goto pm_write_error;
    
    if (midi->latency == 0) {
        midi->now = 0;
    } else {
        midi->now = (*(midi->time_proc))(midi->time_info);
        if (midi->first_message || midi->sync_time + 100 /*ms*/ < midi->now) {
            /* time to resync */
            midi->now = (*midi->dictionary->synchronize)(midi);
            midi->first_message = FALSE;
        }
    }
    /* error recovery: when a sysex is detected, we call
     *   dictionary->begin_sysex() followed by calls to
     *   dictionary->write_byte() and dictionary->write_realtime()
     *   until an end-of-sysex is detected, when we call
     *   dictionary->end_sysex(). After an error occurs, 
     *   Pm_Write() continues to call functions. For example,
     *   it will continue to call write_byte() even after
     *   an error sending a sysex message, and end_sysex() will be
     *   called when an EOX or non-real-time status is found.
     * When errors are detected, Pm_Write() returns immediately, 
     *   so it is possible that this will drop data and leave
     *   sysex messages in a partially transmitted state.
     */
    for (i = 0; i < length; i++) {
        uint32_t msg = buffer[i].message;
        bits = 0;
        /* is this a sysex message? */
        if (Pm_MessageStatus(msg) == MIDI_SYSEX) {
            if (midi->sysex_in_progress) {
                /* error: previous sysex was not terminated by EOX */
                midi->sysex_in_progress = FALSE;
                err = pmBadData;
                goto pm_write_error;
            }
            midi->sysex_in_progress = TRUE;
            if ((err = (*midi->dictionary->begin_sysex)(midi, 
                               buffer[i].timestamp)) != pmNoError)
                goto pm_write_error;
            if ((err = (*midi->dictionary->write_byte)(midi, MIDI_SYSEX,
                               buffer[i].timestamp)) != pmNoError) 
                goto pm_write_error;
            bits = 8;
            /* fall through to continue sysex processing */
        } else if ((msg & MIDI_STATUS_MASK) && 
                   (Pm_MessageStatus(msg) != MIDI_EOX)) {
            /* a non-sysex message */
            if (midi->sysex_in_progress) {
                /* this should be a realtime message */
                if (is_real_time(msg)) {
                    if ((err = (*midi->dictionary->write_realtime)(midi, 
                                       &(buffer[i]))) != pmNoError)
                        goto pm_write_error;
                } else {
                    midi->sysex_in_progress = FALSE;
                    err = pmBadData;
                    /* ignore any error from this, because we already have one */
                    /* pass 0 as timestamp -- it's ignored */
                    (*midi->dictionary->end_sysex)(midi, 0);
                    goto pm_write_error;
                }
            } else { /* regular short midi message */
                if ((err = (*midi->dictionary->write_short)(midi, 
                                   &(buffer[i]))) != pmNoError)
                    goto pm_write_error;
                continue;
            }
        }
        if (midi->sysex_in_progress) { /* send sysex bytes until EOX */
            /* see if we can accelerate data transfer */
            if (bits == 0 && midi->fill_base && /* 4 bytes to copy */
                (*midi->fill_offset_ptr) + 4 <= midi->fill_length &&
                (msg & 0x80808080) == 0) { /* all data */
                    /* copy 4 bytes from msg to fill_base + fill_offset */
                    unsigned char *ptr = midi->fill_base + 
                                         *(midi->fill_offset_ptr);
                    ptr[0] = msg; ptr[1] = msg >> 8; 
                    ptr[2] = msg >> 16; ptr[3] = msg >> 24;
                    (*midi->fill_offset_ptr) += 4;
                     continue;
            }
            /* no acceleration, so do byte-by-byte copying */
            while (bits < 32) {
                unsigned char midi_byte = (unsigned char) (msg >> bits);
                if ((err = (*midi->dictionary->write_byte)(midi, midi_byte, 
                                   buffer[i].timestamp)) != pmNoError)
                    goto pm_write_error;
                if (midi_byte == MIDI_EOX) {
                    err = pm_end_sysex(midi);
                    if (err != pmNoError) goto error_exit;
                    break; /* from while loop */
                }
                bits += 8;
            }
        } else {
            /* not in sysex mode, but message did not start with status */
            err = pmBadData;
            goto pm_write_error;
        }
    }
    /* after all messages are processed, send the data */
    if (!midi->sysex_in_progress)
        err = (*midi->dictionary->write_flush)(midi, 0);
pm_write_error:
    if (err == pmHostError) {
        midi->dictionary->host_error(midi, pm_hosterror_text, 
                                     PM_HOST_ERROR_MSG_LEN);
        pm_hosterror = TRUE;
    }
error_exit:
    return pm_errmsg(err);
}